

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_a155d9::StandardLevelComputer::~StandardLevelComputer
          (StandardLevelComputer *this)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->LevelsAsStrings);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->Levels).super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

explicit StandardLevelComputer(std::string lang, std::vector<int> levels,
                                 std::vector<std::string> levelsStr)
    : Language(std::move(lang))
    , Levels(std::move(levels))
    , LevelsAsStrings(std::move(levelsStr))
  {
    assert(this->Levels.size() == this->LevelsAsStrings.size());
  }